

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

ActionResultHolder<solitaire::graphics::TextureId> *
testing::internal::ActionResultHolder<solitaire::graphics::TextureId>::
PerformAction<solitaire::graphics::TextureId(std::__cxx11::string_const&)>
          (Action<solitaire::graphics::TextureId_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           *action,ArgumentTuple *args)

{
  ActionResultHolder<solitaire::graphics::TextureId> *pAVar1;
  undefined4 local_24;
  undefined8 local_20;
  
  pAVar1 = (ActionResultHolder<solitaire::graphics::TextureId> *)operator_new(0x10);
  local_20 = (args->
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             ).
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
             ._M_head_impl;
  Action<solitaire::graphics::TextureId_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::Perform((Action<solitaire::graphics::TextureId_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *)&stack0xffffffffffffffdc,(ArgumentTuple *)action);
  (pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_00325d48;
  (pAVar1->result_).value_.t = local_24;
  return pAVar1;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }